

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * fmt::v6::internal::format_uint<1u,wchar_t,unsigned_long>
                    (wchar_t *buffer,unsigned_long value,int num_digits,bool upper)

{
  bool bVar1;
  wchar_t *pwVar2;
  
  pwVar2 = buffer + num_digits;
  do {
    pwVar2 = pwVar2 + -1;
    *pwVar2 = (uint)value & 1 | 0x30;
    bVar1 = 1 < value;
    value = value >> 1;
  } while (bVar1);
  return buffer + num_digits;
}

Assistant:

inline Char* format_uint(Char* buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : data::hex_digits;
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}